

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O3

string * __thiscall
Function::Prologue::to_string_abi_cxx11_(string *__return_storage_ptr__,Prologue *this,int indent)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  string indent_str;
  char buff [512];
  long *local_280;
  long local_278;
  long local_270 [2];
  string local_260;
  string *local_240;
  char local_238 [520];
  
  local_280 = local_270;
  std::__cxx11::string::_M_construct((ulong)&local_280,(char)indent);
  if (this->decoded == false) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_280,local_278 + (long)local_280);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    iVar1 = sprintf(local_238,"%sstack: total 0x%02x, fp? %d ra? %d ep? %d",local_280,
                    (ulong)(uint)this->total_stack_usage,(ulong)this->fp_set,
                    (ulong)this->ra_backed_up,(uint)this->epilogue_ok);
    pcVar3 = local_238 + iVar1;
    if (this->n_stack_var_bytes != 0) {
      iVar1 = sprintf(pcVar3,"\n%sstack_vars: %d bytes at %d",local_280,
                      (ulong)(uint)this->n_stack_var_bytes,(ulong)(uint)this->stack_var_offset);
      pcVar3 = pcVar3 + iVar1;
    }
    local_240 = __return_storage_ptr__;
    if (this->n_gpr_backup != 0) {
      iVar1 = sprintf(pcVar3,"\n%sgprs:",local_280);
      pcVar3 = pcVar3 + iVar1;
      if (0 < this->n_gpr_backup) {
        lVar5 = 0;
        uVar4 = 0;
        do {
          if ((ulong)(DAT_001609c0 - (anonymous_namespace)::gpr_backups >> 1) <= uVar4) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar4);
          }
          Register::to_string_abi_cxx11_
                    (&local_260,(Register *)((anonymous_namespace)::gpr_backups + lVar5));
          iVar1 = sprintf(pcVar3," %s",local_260._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          pcVar3 = pcVar3 + iVar1;
          uVar4 = uVar4 + 1;
          lVar5 = lVar5 + 2;
        } while ((long)uVar4 < (long)this->n_gpr_backup);
      }
    }
    if ((this->n_fpr_backup != 0) &&
       (iVar1 = sprintf(pcVar3,"\n%sfprs:",local_280), 0 < this->n_fpr_backup)) {
      pcVar3 = pcVar3 + iVar1;
      lVar5 = 0;
      uVar4 = 0;
      do {
        if ((ulong)(DAT_001609d8 - (anonymous_namespace)::fpr_backups >> 1) <= uVar4) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar4);
        }
        Register::to_string_abi_cxx11_
                  (&local_260,(Register *)((anonymous_namespace)::fpr_backups + lVar5));
        iVar1 = sprintf(pcVar3," %s",local_260._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        pcVar3 = pcVar3 + iVar1;
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 2;
      } while ((long)uVar4 < (long)this->n_fpr_backup);
    }
    __return_storage_ptr__ = local_240;
    (local_240->_M_dataplus)._M_p = (pointer)&local_240->field_2;
    sVar2 = strlen(local_238);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_238,local_238 + sVar2);
  }
  if (local_280 != local_270) {
    operator_delete(local_280,local_270[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Function::Prologue::to_string(int indent) const {
  char buff[512];
  char* buff_ptr = buff;
  std::string indent_str(indent, ' ');
  if (!decoded) {
    return indent_str + "BAD PROLOGUE";
  }
  buff_ptr += sprintf(buff_ptr, "%sstack: total 0x%02x, fp? %d ra? %d ep? %d", indent_str.c_str(),
                      total_stack_usage, fp_set, ra_backed_up, epilogue_ok);
  if (n_stack_var_bytes) {
    buff_ptr += sprintf(buff_ptr, "\n%sstack_vars: %d bytes at %d", indent_str.c_str(),
                        n_stack_var_bytes, stack_var_offset);
  }
  if (n_gpr_backup) {
    buff_ptr += sprintf(buff_ptr, "\n%sgprs:", indent_str.c_str());
    for (int i = 0; i < n_gpr_backup; i++) {
      buff_ptr += sprintf(buff_ptr, " %s", gpr_backups.at(i).to_string().c_str());
    }
  }
  if (n_fpr_backup) {
    buff_ptr += sprintf(buff_ptr, "\n%sfprs:", indent_str.c_str());
    for (int i = 0; i < n_fpr_backup; i++) {
      buff_ptr += sprintf(buff_ptr, " %s", fpr_backups.at(i).to_string().c_str());
    }
  }
  return {buff};
}